

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O1

int __thiscall
anon_unknown.dwarf_e4c90::builtin_builder::_isinf(builtin_builder *this,double __value)

{
  byte bVar1;
  char cVar2;
  ir_variable *this_00;
  glsl_type *return_type;
  ir_function_signature *piVar3;
  undefined4 extraout_var;
  operand b;
  operand oVar4;
  ir_return *ir;
  byte bVar5;
  ulong uVar6;
  glsl_type *in_RSI;
  ir_factory body;
  ir_constant_data infinities;
  ir_factory local_b8;
  operand local_a8;
  ir_constant_data local_a0;
  
  this_00 = (ir_variable *)exec_node::operator_new(0x90,builtins.mem_ctx);
  ir_variable::ir_variable(this_00,in_RSI,"x",ir_var_function_in);
  return_type = glsl_type::bvec((uint)in_RSI->vector_elements);
  piVar3 = new_sig(&builtins,return_type,(builtin_available_predicate)this,1,this_00);
  local_b8.instructions = &piVar3->body;
  local_b8.mem_ctx = builtins.mem_ctx;
  piVar3->field_0x48 = piVar3->field_0x48 | 1;
  bVar1 = in_RSI->vector_elements;
  if (bVar1 != 0) {
    cVar2 = in_RSI->field_0x4;
    if ((cVar2 != '\x04') && (cVar2 != '\x02')) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/builtin_functions.cpp"
                    ,0x1529,
                    "ir_function_signature *(anonymous namespace)::builtin_builder::_isinf(builtin_available_predicate, const glsl_type *)"
                   );
    }
    bVar5 = 1;
    if (1 < bVar1) {
      bVar5 = bVar1;
    }
    uVar6 = 0;
    do {
      if (cVar2 == '\x02') {
        *(undefined4 *)((long)&local_a0 + uVar6 * 4) = 0x7f800000;
      }
      else {
        *(undefined8 *)((long)&local_a0 + uVar6 * 8) = 0x7ff0000000000000;
      }
      uVar6 = uVar6 + 1;
    } while (bVar5 != uVar6);
  }
  ir_builder::operand::operand(&local_a8,this_00);
  oVar4.val._0_4_ = ir_builder::abs((int)local_a8.val);
  oVar4.val._4_4_ = extraout_var;
  b.val = (ir_rvalue *)exec_node::operator_new(0xb0,builtins.mem_ctx);
  ir_constant::ir_constant((ir_constant *)b.val,in_RSI,&local_a0);
  oVar4.val = &ir_builder::equal(oVar4,b)->super_ir_rvalue;
  ir = ir_builder::ret(oVar4);
  ir_builder::ir_factory::emit(&local_b8,(ir_instruction *)ir);
  return (int)piVar3;
}

Assistant:

ir_function_signature *
builtin_builder::_isinf(builtin_available_predicate avail, const glsl_type *type)
{
   ir_variable *x = in_var(type, "x");
   MAKE_SIG(glsl_type::bvec(type->vector_elements), avail, 1, x);

   ir_constant_data infinities;
   for (int i = 0; i < type->vector_elements; i++) {
      switch (type->base_type) {
      case GLSL_TYPE_FLOAT:
         infinities.f[i] = INFINITY;
         break;
      case GLSL_TYPE_DOUBLE:
         infinities.d[i] = INFINITY;
         break;
      default:
         unreachable("unknown type");
      }
   }

   body.emit(ret(equal(abs(x), imm(type, infinities))));

   return sig;
}